

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_streams.cpp
# Opt level: O0

ssize_t __thiscall BitWriter::write(BitWriter *this,int __fd,void *__buf,size_t __n)

{
  int bit;
  size_t i;
  void *local_20;
  
  for (local_20 = (void *)0x0; local_20 < __buf; local_20 = (void *)((long)local_20 + 1)) {
    this->_buf = this->_buf |
                 (byte)((__fd >> ((byte)local_20 & 0x1f) & 1U) << ((byte)this->_curBit & 0x1f));
    this->_curBit = this->_curBit + 1;
    if (this->_curBit == 8) {
      std::ostream::write((char *)this->_os,(long)&this->_buf);
      this->_curBit = 0;
      this->_buf = '\0';
    }
  }
  return (ssize_t)local_20;
}

Assistant:

void BitWriter::write(int data, std::size_t length) {
    for (std::size_t i = 0; i < length; ++i) {
        int bit = (data >> i) & 1;
        _buf |= (bit << _curBit);
        _curBit++;
        if (_curBit == BITS_IN_BYTE) {
            _os.write((const char*)&_buf, 1);
            _curBit = 0;
            _buf = 0;
        }
    }
}